

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_operationset.c
# Opt level: O0

void FAudio_OPERATIONSET_QueueExitLoop(FAudioSourceVoice *voice,uint32_t OperationSet)

{
  undefined8 in_RDI;
  FAudioVoice *unaff_retaddr;
  
  FAudio_PlatformLockMutex((FAudioMutex)0x13558e);
  QueueOperation(unaff_retaddr,(FAudio_OPERATIONSET_Type)((ulong)in_RDI >> 0x20),(uint32_t)in_RDI);
  FAudio_PlatformUnlockMutex((FAudioMutex)0x1355b2);
  return;
}

Assistant:

void FAudio_OPERATIONSET_QueueExitLoop(
	FAudioSourceVoice *voice,
	uint32_t OperationSet
) {
	FAudio_PlatformLockMutex(voice->audio->operationLock);
	LOG_MUTEX_LOCK(voice->audio, voice->audio->operationLock)

	QueueOperation(
		voice,
		FAUDIOOP_EXITLOOP,
		OperationSet
	);

	/* No special data for ExitLoop */

	FAudio_PlatformUnlockMutex(voice->audio->operationLock);
	LOG_MUTEX_UNLOCK(voice->audio, voice->audio->operationLock)
}